

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

void drwav_s24_to_f32(float *pOut,drwav_uint8 *pIn,size_t sampleCount)

{
  size_t sVar1;
  byte *pbVar2;
  
  if (pIn != (drwav_uint8 *)0x0 && pOut != (float *)0x0) {
    pbVar2 = pIn + 2;
    for (sVar1 = 0; sampleCount != sVar1; sVar1 = sVar1 + 1) {
      pOut[sVar1] = (float)(int)((uint)*pbVar2 << 0x18 | (uint)*(ushort *)(pbVar2 + -2) << 8) *
                    4.656613e-10;
      pbVar2 = pbVar2 + 3;
    }
  }
  return;
}

Assistant:

void drwav_s24_to_f32(float* pOut, const drwav_uint8* pIn, size_t sampleCount)
{
    if (pOut == NULL || pIn == NULL) {
        return;
    }

    for (size_t i = 0; i < sampleCount; ++i) {
        unsigned int s0 = pIn[i*3 + 0];
        unsigned int s1 = pIn[i*3 + 1];
        unsigned int s2 = pIn[i*3 + 2];

        int sample32 = (int)((s0 << 8) | (s1 << 16) | (s2 << 24));
        *pOut++ = (float)(sample32 / 2147483648.0);
    }
}